

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# degree_histogram_converter_impl.h
# Opt level: O0

void __thiscall
degree_histogram_converter::Converter<label::StringLabel>::create_histogram
          (Converter<label::StringLabel> *this,
          vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
          *trees_collection,
          vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
          *histogram_collection)

{
  bool bVar1;
  int local_7c;
  undefined1 local_78 [4];
  int tree_size;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  degree_histogram;
  Node<label::StringLabel> *tree;
  const_iterator __end0;
  const_iterator __begin0;
  vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_> *__range2
  ;
  vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
  *histogram_collection_local;
  vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
  *trees_collection_local;
  Converter<label::StringLabel> *this_local;
  
  __end0 = std::
           vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
           ::begin(trees_collection);
  tree = (Node<label::StringLabel> *)
         std::
         vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>::
         end(trees_collection);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_node::Node<label::StringLabel>_*,_std::vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>_>
                                *)&tree);
    if (!bVar1) break;
    degree_histogram._M_h._M_single_bucket =
         (__node_base_ptr)
         __gnu_cxx::
         __normal_iterator<const_node::Node<label::StringLabel>_*,_std::vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>_>
         ::operator*(&__end0);
    std::
    unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)local_78);
    local_7c = 0;
    create_degree_histrogram
              (this,(Node<label::StringLabel> *)degree_histogram._M_h._M_single_bucket,
               (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                *)local_78,&local_7c);
    std::
    vector<std::pair<int,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>>,std::allocator<std::pair<int,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>>>>
    ::
    emplace_back<int&,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>&>
              ((vector<std::pair<int,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>>,std::allocator<std::pair<int,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>>>>
                *)histogram_collection,&local_7c,
               (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                *)local_78);
    std::
    unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                      *)local_78);
    __gnu_cxx::
    __normal_iterator<const_node::Node<label::StringLabel>_*,_std::vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void Converter<Label>::create_histogram(
    const std::vector<node::Node<Label>>& trees_collection,
    std::vector<std::pair<int, std::unordered_map<int, int>>>& histogram_collection) {

  // for each tree in the tree collection
  for (const auto& tree: trees_collection) {
    // stores the number of nodes per degree
    std::unordered_map<int, int> degree_histogram;
    // stores the number of nodes per degree
    int tree_size = 0;
    // traverse tree and store number of nodes per degree
    create_degree_histrogram(tree, degree_histogram, tree_size);
    // add degree histogram to collection
    histogram_collection.emplace_back(tree_size, degree_histogram);
  }
}